

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O0

__pid_t __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::wait
          (tsqueue<blcl::net::owned_message<MsgType>_> *this,void *__stat_loc)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lk;
  tsqueue<blcl::net::owned_message<MsgType>_> *this_local;
  
  lk._8_8_ = this;
  while( true ) {
    bVar1 = empty(this);
    if (!bVar1) break;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_20,&this->to_update_mtx_);
    std::condition_variable::wait((unique_lock *)&this->to_update_cv_);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  }
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

void wait() {
            while (empty()) {
                std::unique_lock<std::mutex> lk(to_update_mtx_);
                to_update_cv_.wait(lk);
            }
        }